

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

size_t secp256k1_count_bits_set(uchar *data,size_t count)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = 0;
  for (sVar2 = 0; count != sVar2; sVar2 = sVar2 + 1) {
    sVar1 = sVar1 + (((uint)data[sVar2] * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1c);
  }
  return sVar1;
}

Assistant:

static size_t secp256k1_count_bits_set(const unsigned char* data, size_t count) {
    size_t ret = 0;
    size_t i;
    for (i = 0; i < count; i++) {
#ifdef HAVE_BUILTIN_POPCOUNT
	ret += __builtin_popcount(data[i]);
#else
        ret += !!(data[i] & 0x1);
        ret += !!(data[i] & 0x2);
        ret += !!(data[i] & 0x4);
        ret += !!(data[i] & 0x8);
        ret += !!(data[i] & 0x10);
        ret += !!(data[i] & 0x20);
        ret += !!(data[i] & 0x40);
        ret += !!(data[i] & 0x80);
#endif
    }
    return ret;
}